

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  char *str_local;
  char *pattern_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = *pattern;
  if (cVar1 != '\0') {
    if (cVar1 == '*') {
      if (*str == '\0') {
LAB_0018ff31:
        local_2e = PatternMatchesString(pattern + 1,str);
      }
      else {
        bVar3 = PatternMatchesString(pattern,str + 1);
        local_2e = true;
        if (!bVar3) goto LAB_0018ff31;
      }
      pattern_local._7_1_ = local_2e;
      goto LAB_0018ff86;
    }
    if (cVar1 != ':') {
      if (cVar1 == '?') {
        local_2d = false;
        if (*str != '\0') {
          local_2d = PatternMatchesString(pattern + 1,str + 1);
        }
        pattern_local._7_1_ = local_2d;
      }
      else {
        local_2f = false;
        if (*pattern == *str) {
          local_2f = PatternMatchesString(pattern + 1,str + 1);
        }
        pattern_local._7_1_ = local_2f;
      }
      goto LAB_0018ff86;
    }
  }
  pattern_local._7_1_ = *str == '\0';
LAB_0018ff86:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return pattern_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool UnitTestOptions::PatternMatchesString(const char *pattern,
                                           const char *str) {
  switch (*pattern) {
    case '\0':
    case ':':  // Either ':' or '\0' marks the end of the pattern.
      return *str == '\0';
    case '?':  // Matches any single character.
      return *str != '\0' && PatternMatchesString(pattern + 1, str + 1);
    case '*':  // Matches any string (possibly empty) of characters.
      return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
          PatternMatchesString(pattern + 1, str);
    default:  // Non-special character.  Matches itself.
      return *pattern == *str &&
          PatternMatchesString(pattern + 1, str + 1);
  }
}